

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::ReadAsmJsConstantsTable
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  uint32 uVar5;
  Type *pTVar6;
  AsmJsFunctionInfo *this_00;
  TypedSlotInfo *pTVar7;
  undefined4 *puVar8;
  uint local_5c;
  byte *pbStack_58;
  uint32 reg;
  size_t remainingBytes;
  byte *byteTable;
  uint32 typeSize;
  uint32 constCount;
  TypedSlotInfo *typedInfo;
  Types type;
  int i;
  byte *tableEnd;
  Type *constTable;
  FunctionBody *function_local;
  byte *current_local;
  ByteCodeBufferReader *this_local;
  
  FunctionBody::CreateConstantTable(function);
  pTVar6 = FunctionBody::GetConstTable(function);
  RVar4 = FunctionBody::GetConstantCount(function);
  typedInfo._4_4_ = INT32;
  function_local = (FunctionBody *)current;
  do {
    if (4 < (int)typedInfo._4_4_) {
      return (byte *)function_local;
    }
    this_00 = FunctionBody::GetAsmJsFunctionInfo(function);
    pTVar7 = AsmJsFunctionInfo::GetTypedSlotInfo(this_00,typedInfo._4_4_);
    uVar1 = pTVar7->constCount;
    if (1 < uVar1) {
      uVar5 = WAsmJs::GetTypeByteSize(typedInfo._4_4_);
      remainingBytes = (long)&pTVar6->ptr + (ulong)uVar5 + (ulong)pTVar7->constSrcByteOffset;
      pbStack_58 = this->raw + ((long)this->totalSize - (long)function_local);
      for (local_5c = 1; local_5c < uVar1; local_5c = local_5c + 1) {
        if (typedInfo._4_4_ == INT32) {
          ReadConstantSizedInt32((byte *)function_local,(size_t)pbStack_58,(int *)remainingBytes);
        }
        else if (typedInfo._4_4_ == FLOAT32) {
          ReadFloat((byte *)function_local,(size_t)pbStack_58,(float *)remainingBytes);
        }
        else {
          if (typedInfo._4_4_ != FLOAT64) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                        ,0xcee,"((0))","UNREACHED");
            if (bVar3) {
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
              Throw::FatalInternalError(-0x7fffbffb);
            }
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          ReadDouble((byte *)function_local,(size_t)pbStack_58,(double *)remainingBytes);
        }
        function_local =
             (FunctionBody *)
             ((long)&(function_local->super_ParseableFunctionInfo).super_FunctionProxy.
                     super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject + (ulong)uVar5);
        remainingBytes = remainingBytes + uVar5;
        pbStack_58 = pbStack_58 + -(ulong)uVar5;
      }
      if (pTVar6 + RVar4 < remainingBytes) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0xcf9,"((0))","UNREACHED");
        if (bVar3) {
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
          Throw::FatalInternalError(-0x7fffbffb);
        }
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    typedInfo._4_4_ = typedInfo._4_4_ + INT64;
  } while( true );
}

Assistant:

const byte * ReadAsmJsConstantsTable(const byte * current, FunctionBody * function)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfConstantTable);
#endif

        function->CreateConstantTable();

        auto constTable = function->GetConstTable();
        byte* tableEnd = (byte*)(constTable + function->GetConstantCount());

        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            WAsmJs::Types type = (WAsmJs::Types)i;
            WAsmJs::TypedSlotInfo* typedInfo = function->GetAsmJsFunctionInfo()->GetTypedSlotInfo(type);
            uint32 constCount = typedInfo->constCount;
            if (constCount > FunctionBody::FirstRegSlot)
            {
                uint32 typeSize = WAsmJs::GetTypeByteSize(type);
                byte* byteTable = ((byte*)constTable) + typedInfo->constSrcByteOffset;
                byteTable += typeSize * FunctionBody::FirstRegSlot;

                size_t remainingBytes = (raw + totalSize) - current;
                for (uint32 reg = FunctionBody::FirstRegSlot; reg < constCount; ++reg)
                {
                    switch (type)
                    {
                    case WAsmJs::INT32:   ReadConstantSizedInt32(current, remainingBytes, (int*)byteTable); break;
                    case WAsmJs::FLOAT32: ReadFloat(current, remainingBytes, (float*)byteTable); break;
                    case WAsmJs::FLOAT64: ReadDouble(current, remainingBytes, (double*)byteTable); break;
                    default:
                        Assert(UNREACHED);
                        Js::Throw::FatalInternalError();
                        break;
                    }
                    current += typeSize;
                    byteTable += typeSize;
                    remainingBytes -= typeSize;
                }

                if (byteTable > tableEnd)
                {
                    Assert(UNREACHED);
                    Js::Throw::FatalInternalError();
                }
            }
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfConstantTable);
#endif

        return current;
    }